

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O2

base_learner * log_multi_setup(options_i *options,vw *all)

{
  int iVar1;
  option_group_definition *poVar2;
  typed_option<unsigned_int> *ptVar3;
  loss_function *plVar4;
  base_learner *l;
  single_learner *base;
  learner<log_multi,_example> *plVar5;
  allocator local_438;
  allocator local_437;
  allocator local_436;
  allocator local_435;
  allocator local_434;
  allocator local_433;
  allocator local_432;
  allocator local_431;
  free_ptr<log_multi> data;
  string local_420;
  string local_400 [32];
  string local_3e0;
  string local_3c0 [32];
  string local_3a0;
  string local_380 [32];
  string local_360;
  string local_340 [32];
  string local_320;
  string local_300;
  string loss_function;
  string local_2b0 [64];
  bool local_270;
  option_group_definition new_options;
  undefined1 local_208 [160];
  typed_option<unsigned_int> local_168;
  typed_option<unsigned_int> local_c8;
  
  scoped_calloc_or_throw<log_multi>();
  std::__cxx11::string::string
            ((string *)&local_300,"Logarithmic Time Multiclass Tree",(allocator *)&loss_function);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::string((string *)&local_320,"log_multi",&local_431);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)&loss_function,&local_320,
             &(data._M_t.super___uniq_ptr_impl<log_multi,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_log_multi_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_log_multi_*,_false>._M_head_impl)->k);
  local_270 = true;
  std::__cxx11::string::string(local_340,"Use online tree for multiclass",&local_432);
  std::__cxx11::string::_M_assign(local_2b0);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (&new_options,(typed_option<unsigned_int> *)&loss_function);
  std::__cxx11::string::string((string *)&local_360,"no_progress",&local_433);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_208,&local_360,
             &(data._M_t.super___uniq_ptr_impl<log_multi,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_log_multi_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_log_multi_*,_false>._M_head_impl)->progress);
  std::__cxx11::string::string(local_380,"disable progressive validation",&local_434);
  std::__cxx11::string::_M_assign((string *)(local_208 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar2,(typed_option<bool> *)local_208);
  std::__cxx11::string::string((string *)&local_3a0,"swap_resistance",&local_435);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_c8,&local_3a0,
             &(data._M_t.super___uniq_ptr_impl<log_multi,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_log_multi_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_log_multi_*,_false>._M_head_impl)->swap_resist);
  ptVar3 = VW::config::typed_option<unsigned_int>::default_value(&local_c8,4);
  std::__cxx11::string::string(local_3c0,"disable progressive validation",&local_436);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar2,ptVar3);
  std::__cxx11::string::string((string *)&local_3e0,"swap_resistance",&local_437);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_168,&local_3e0,
             &(data._M_t.super___uniq_ptr_impl<log_multi,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_log_multi_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_log_multi_*,_false>._M_head_impl)->swap_resist);
  ptVar3 = VW::config::typed_option<unsigned_int>::default_value(&local_168,4);
  std::__cxx11::string::string(local_400,"higher = more resistance to swap, default=4",&local_438);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>(poVar2,ptVar3);
  std::__cxx11::string::~string(local_400);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_168);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string(local_3c0);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_c8);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string(local_380);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_208);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string(local_340);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)&loss_function);
  std::__cxx11::string::~string((string *)&local_320);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&loss_function,"log_multi",(allocator *)local_208);
  iVar1 = (*options->_vptr_options_i[1])(options,&loss_function);
  std::__cxx11::string::~string((string *)&loss_function);
  if ((char)iVar1 == '\0') {
    plVar5 = (learner<log_multi,_example> *)0x0;
  }
  else {
    (data._M_t.super___uniq_ptr_impl<log_multi,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_log_multi_*,_void_(*)(void_*)>.super__Head_base<0UL,_log_multi_*,_false>
    ._M_head_impl)->progress =
         (bool)((data._M_t.super___uniq_ptr_impl<log_multi,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_log_multi_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_log_multi_*,_false>._M_head_impl)->progress ^ 1);
    std::__cxx11::string::string((string *)&loss_function,"quantile",(allocator *)local_208);
    if (all->loss != (loss_function *)0x0) {
      (*all->loss->_vptr_loss_function[9])();
    }
    std::__cxx11::string::string((string *)&local_420,(string *)&loss_function);
    plVar4 = getLossFunction(all,&local_420,0.5);
    all->loss = plVar4;
    std::__cxx11::string::~string((string *)&local_420);
    (data._M_t.super___uniq_ptr_impl<log_multi,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_log_multi_*,_void_(*)(void_*)>.super__Head_base<0UL,_log_multi_*,_false>
    ._M_head_impl)->max_predictors =
         (ulong)((data._M_t.super___uniq_ptr_impl<log_multi,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_log_multi_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_log_multi_*,_false>._M_head_impl)->k - 1);
    init_tree(data._M_t.super___uniq_ptr_impl<log_multi,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_log_multi_*,_void_(*)(void_*)>.
              super__Head_base<0UL,_log_multi_*,_false>._M_head_impl);
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar5 = LEARNER::init_multiclass_learner<log_multi,example,LEARNER::learner<char,example>>
                       (&data,base,learn,predict,all->p,
                        (data._M_t.super___uniq_ptr_impl<log_multi,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_log_multi_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_log_multi_*,_false>._M_head_impl)->max_predictors,
                        multiclass);
    *(code **)(plVar5 + 0x80) = save_load_tree;
    *(undefined8 *)(plVar5 + 0x70) = *(undefined8 *)(plVar5 + 0x18);
    *(undefined8 *)(plVar5 + 0x78) = *(undefined8 *)(plVar5 + 0x20);
    *(undefined8 *)(plVar5 + 0xb8) = *(undefined8 *)(plVar5 + 0x18);
    *(undefined8 *)(plVar5 + 0xc0) = *(undefined8 *)(plVar5 + 0x20);
    *(code **)(plVar5 + 200) = finish;
    std::__cxx11::string::~string((string *)&loss_function);
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<log_multi,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar5;
}

Assistant:

base_learner* log_multi_setup(options_i& options, vw& all)  // learner setup
{
  auto data = scoped_calloc_or_throw<log_multi>();
  option_group_definition new_options("Logarithmic Time Multiclass Tree");
  new_options.add(make_option("log_multi", data->k).keep().help("Use online tree for multiclass"))
      .add(make_option("no_progress", data->progress).help("disable progressive validation"))
      .add(make_option("swap_resistance", data->swap_resist).default_value(4).help("disable progressive validation"))
      .add(make_option("swap_resistance", data->swap_resist)
               .default_value(4)
               .help("higher = more resistance to swap, default=4"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("log_multi"))
    return nullptr;

  data->progress = !data->progress;

  string loss_function = "quantile";
  float loss_parameter = 0.5;
  delete (all.loss);
  all.loss = getLossFunction(all, loss_function, loss_parameter);

  data->max_predictors = data->k - 1;
  init_tree(*data.get());

  learner<log_multi, example>& l = init_multiclass_learner(
      data, as_singleline(setup_base(options, all)), learn, predict, all.p, data->max_predictors);
  l.set_save_load(save_load_tree);
  l.set_finish(finish);

  return make_base(l);
}